

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O0

void mod2sparse_add(mod2sparse *m1,mod2sparse *m2,mod2sparse *r)

{
  mod2sparse *in_RDX;
  mod2sparse *in_RSI;
  mod2sparse *in_RDI;
  bool bVar1;
  int i;
  mod2entry *e2;
  mod2entry *e1;
  int local_2c;
  mod2entry *local_28;
  mod2sparse *in_stack_ffffffffffffffe0;
  int row;
  mod2entry *pmVar2;
  
  if ((((in_RDI->n_rows == in_RDX->n_rows) && (in_RDI->n_cols == in_RDX->n_cols)) &&
      (in_RSI->n_rows == in_RDX->n_rows)) && (in_RSI->n_cols == in_RDX->n_cols)) {
    if ((in_RDX != in_RDI) && (in_RDX != in_RSI)) {
      mod2sparse_clear(in_stack_ffffffffffffffe0);
      for (local_2c = 0; local_2c < in_RDX->n_rows; local_2c = local_2c + 1) {
        pmVar2 = in_RDI->rows[local_2c].right;
        local_28 = in_RSI->rows[local_2c].right;
        while( true ) {
          bVar1 = false;
          if (-1 < pmVar2->row) {
            bVar1 = -1 < local_28->row;
          }
          if (!bVar1) break;
          if (pmVar2->col == local_28->col) {
            pmVar2 = pmVar2->right;
            local_28 = local_28->right;
          }
          else {
            row = (int)((ulong)pmVar2 >> 0x20);
            if (pmVar2->col < local_28->col) {
              mod2sparse_insert(in_RDX,row,(int)pmVar2);
              pmVar2 = pmVar2->right;
            }
            else {
              mod2sparse_insert(in_RDX,row,(int)pmVar2);
              local_28 = local_28->right;
            }
          }
        }
        for (; -1 < pmVar2->row; pmVar2 = pmVar2->right) {
          mod2sparse_insert(in_RDX,(int)((ulong)pmVar2 >> 0x20),(int)pmVar2);
        }
        for (; -1 < local_28->row; local_28 = local_28->right) {
          mod2sparse_insert(in_RDX,(int)((ulong)pmVar2 >> 0x20),(int)pmVar2);
        }
      }
      return;
    }
    fprintf(_stderr,"mod2sparse_add: Result matrix is the same as one of the operands\n");
    exit(1);
  }
  fprintf(_stderr,"mod2sparse_add: Matrices have different dimensions\n");
  exit(1);
}

Assistant:

void mod2sparse_add
( mod2sparse *m1,	/* Left operand of add */
  mod2sparse *m2,	/* Right operand of add */
  mod2sparse *r		/* Place to store result of add */
)
{
  mod2entry *e1, *e2;
  int i;

  if (mod2sparse_rows(m1)!=mod2sparse_rows(r) 
   || mod2sparse_cols(m1)!=mod2sparse_cols(r) 
   || mod2sparse_rows(m2)!=mod2sparse_rows(r)
   || mod2sparse_cols(m2)!=mod2sparse_cols(r)) 
  { fprintf(stderr,"mod2sparse_add: Matrices have different dimensions\n");
    exit(1);
  }

  if (r==m1 || r==m2)
  { fprintf(stderr,
     "mod2sparse_add: Result matrix is the same as one of the operands\n");
    exit(1);
  }

  mod2sparse_clear(r);

  for (i = 0; i<mod2sparse_rows(r); i++)
  { 
    e1 = mod2sparse_first_in_row(m1,i);
    e2 = mod2sparse_first_in_row(m2,i);

    while (!mod2sparse_at_end(e1) && !mod2sparse_at_end(e2))
    { 
      if (mod2sparse_col(e1)==mod2sparse_col(e2))
      { e1 = mod2sparse_next_in_row(e1);
        e2 = mod2sparse_next_in_row(e2); 
      }

      else if (mod2sparse_col(e1)<mod2sparse_col(e2))
      { mod2sparse_insert(r,i,mod2sparse_col(e1));
        e1 = mod2sparse_next_in_row(e1);
      }

      else
      { mod2sparse_insert(r,i,mod2sparse_col(e2));
        e2 = mod2sparse_next_in_row(e2);       
      }
    }

    while (!mod2sparse_at_end(e1))
    { mod2sparse_insert(r,i,mod2sparse_col(e1));
      e1 = mod2sparse_next_in_row(e1);
    }

    while (!mod2sparse_at_end(e2))
    { mod2sparse_insert(r,i,mod2sparse_col(e2));
      e2 = mod2sparse_next_in_row(e2);
    }
  }
}